

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O3

void __thiscall
Eigen::RefBase<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>>::
construct<Eigen::Matrix<double,_1,1,0,_1,1>>
          (RefBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>> *this,
          Matrix<double,__1,_1,_0,__1,_1> *expr)

{
  double *pdVar1;
  long lVar2;
  
  pdVar1 = (expr->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  lVar2 = (expr->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  *(double **)this = pdVar1;
  *(long *)(this + 8) = lVar2;
  if (-1 < lVar2 || pdVar1 == (double *)0x0) {
    return;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/MapBase.h"
                ,0xb0,
                "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC T *data() { return m_data; }